

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIsComplete.cpp
# Opt level: O1

void testIsComplete(string *tempDir)

{
  pointer pcVar1;
  ushort uVar2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  bool bVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  Rgba *base;
  int y;
  long lVar12;
  int x;
  long lVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  RgbaOutputFile out;
  uif x_1;
  string ict;
  string ct;
  string icsl;
  string csl;
  Rgba *local_80;
  V2f local_50;
  V2f local_48;
  V2f local_40;
  V2f local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing isComplete() function",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  csl._M_dataplus._M_p = (pointer)&csl.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&csl,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&csl);
  icsl._M_dataplus._M_p = (pointer)&icsl.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&icsl,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&icsl);
  ct._M_dataplus._M_p = (pointer)&ct.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&ct,pcVar1,pcVar1 + tempDir->_M_string_length)
  ;
  std::__cxx11::string::append((char *)&ct);
  ict._M_dataplus._M_p = (pointer)&ict.field_2;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&ict,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&ict);
  _Var6 = csl._M_dataplus;
  _Var5 = icsl._M_dataplus;
  _Var4 = ct._M_dataplus;
  _Var3 = ict._M_dataplus;
  base = (Rgba *)operator_new__(0xb8938);
  uVar2 = _DAT_0044213e;
  lVar12 = 0;
  local_80 = base;
  do {
    fVar15 = (float)(int)lVar12;
    lVar13 = 0;
    do {
      fVar16 = (float)(int)lVar13;
      if (lVar13 == 0) {
        uVar9 = (uint)fVar16 >> 0x10;
      }
      else {
        uVar8 = *(ushort *)((long)&half::_eLut + (ulong)((uint)fVar16 >> 0x17) * 2);
        if (uVar8 == 0) {
          uVar9 = half::convert((int)fVar16);
        }
        else {
          uVar9 = (uint)uVar8 +
                  (((uint)fVar16 & 0x7fffff) + 0xfff + (uint)(((uint)fVar16 >> 0xd & 1) != 0) >> 0xd
                  );
        }
      }
      uVar14 = (uint)fVar15 >> 0x10;
      if (lVar12 != 0) {
        uVar8 = *(ushort *)((long)&half::_eLut + (ulong)((uint)fVar15 >> 0x17) * 2);
        if (uVar8 == 0) {
          uVar14 = half::convert((int)fVar15);
        }
        else {
          uVar14 = (uint)uVar8 +
                   (((uint)fVar15 & 0x7fffff) + 0xfff + (uint)(((uint)fVar15 >> 0xd & 1) != 0) >>
                   0xd);
        }
      }
      uVar8 = uVar2;
      if (uVar2 == 0) {
        uVar8 = half::convert(0x3f800000);
      }
      local_80[lVar13] =
           (Rgba)((ulong)(uVar9 & 0xffff) | (ulong)(uVar14 << 0x10) | (ulong)uVar8 << 0x30);
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x147);
    lVar12 = lVar12 + 1;
    local_80 = local_80 + 0x147;
  } while (lVar12 != 0x121);
  local_38.x = 0.0;
  local_38.y = 0.0;
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile
            (&out,_Var6._M_p,0x147,0x121,WRITE_RGBA,1.0,&local_38,1.0,INCREASING_Y,PIZ_COMPRESSION,
             iVar10);
  Imf_2_5::RgbaOutputFile::setFrameBuffer(&out,base,1,0x147);
  Imf_2_5::RgbaOutputFile::writePixels(&out,0x121);
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&out);
  local_40.x = 0.0;
  local_40.y = 0.0;
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile
            (&out,_Var5._M_p,0x147,0x121,WRITE_RGBA,1.0,&local_40,1.0,INCREASING_Y,PIZ_COMPRESSION,
             iVar10);
  Imf_2_5::RgbaOutputFile::setFrameBuffer(&out,base,1,0x147);
  Imf_2_5::RgbaOutputFile::writePixels(&out,0x120);
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&out);
  local_48.x = 0.0;
  local_48.y = 0.0;
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)&out,_Var4._M_p,0x147,0x121,0x11,0x11,ONE_LEVEL,ROUND_DOWN,
             WRITE_RGBA,1.0,&local_48,1.0,INCREASING_Y,ZIP_COMPRESSION,iVar10);
  Imf_2_5::TiledRgbaOutputFile::setFrameBuffer((TiledRgbaOutputFile *)&out,base,1,0x147);
  iVar10 = Imf_2_5::TiledRgbaOutputFile::numXTiles((TiledRgbaOutputFile *)&out,0);
  iVar11 = Imf_2_5::TiledRgbaOutputFile::numYTiles((TiledRgbaOutputFile *)&out,0);
  Imf_2_5::TiledRgbaOutputFile::writeTiles
            ((TiledRgbaOutputFile *)&out,0,iVar10 + -1,0,iVar11 + -1,0);
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
  local_50.x = 0.0;
  local_50.y = 0.0;
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)&out,_Var3._M_p,0x147,0x121,0x11,0x11,ONE_LEVEL,ROUND_DOWN,
             WRITE_RGBA,1.0,&local_50,1.0,INCREASING_Y,ZIP_COMPRESSION,iVar10);
  Imf_2_5::TiledRgbaOutputFile::setFrameBuffer((TiledRgbaOutputFile *)&out,base,1,0x147);
  iVar10 = Imf_2_5::TiledRgbaOutputFile::numXTiles((TiledRgbaOutputFile *)&out,0);
  iVar11 = Imf_2_5::TiledRgbaOutputFile::numYTiles((TiledRgbaOutputFile *)&out,0);
  Imf_2_5::TiledRgbaOutputFile::writeTiles
            ((TiledRgbaOutputFile *)&out,0,iVar10 + -1,0,iVar11 + -2,0);
  Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)&out);
  operator_delete__(base);
  _Var6 = csl._M_dataplus;
  _Var5 = icsl._M_dataplus;
  _Var4 = ct._M_dataplus;
  _Var3 = ict._M_dataplus;
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var6._M_p,iVar10);
  bVar7 = Imf_2_5::RgbaInputFile::isComplete((RgbaInputFile *)&out);
  if (!bVar7) {
    __assert_fail("in.isComplete()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                  ,0x6e,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var5._M_p,iVar10);
  bVar7 = Imf_2_5::RgbaInputFile::isComplete((RgbaInputFile *)&out);
  if (bVar7) {
    __assert_fail("!in.isComplete()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                  ,0x73,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var4._M_p,iVar10);
  bVar7 = Imf_2_5::RgbaInputFile::isComplete((RgbaInputFile *)&out);
  if (bVar7) {
    Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
    iVar10 = Imf_2_5::globalThreadCount();
    Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,_Var3._M_p,iVar10);
    bVar7 = Imf_2_5::RgbaInputFile::isComplete((RgbaInputFile *)&out);
    if (bVar7) {
      __assert_fail("!in.isComplete()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                    ,0x7d,
                    "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                   );
    }
    Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
    iVar10 = Imf_2_5::globalThreadCount();
    Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&out,_Var4._M_p,iVar10);
    bVar7 = Imf_2_5::TiledRgbaInputFile::isComplete((TiledRgbaInputFile *)&out);
    if (bVar7) {
      Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
      iVar10 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&out,_Var3._M_p,iVar10);
      bVar7 = Imf_2_5::TiledRgbaInputFile::isComplete((TiledRgbaInputFile *)&out);
      if (!bVar7) {
        Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&out);
        remove(csl._M_dataplus._M_p);
        remove(icsl._M_dataplus._M_p);
        remove(ct._M_dataplus._M_p);
        remove(ict._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ict._M_dataplus._M_p != &ict.field_2) {
          operator_delete(ict._M_dataplus._M_p,ict.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)ct._M_dataplus._M_p != &ct.field_2) {
          operator_delete(ct._M_dataplus._M_p,ct.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)icsl._M_dataplus._M_p != &icsl.field_2) {
          operator_delete(icsl._M_dataplus._M_p,icsl.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)csl._M_dataplus._M_p != &csl.field_2) {
          operator_delete(csl._M_dataplus._M_p,csl.field_2._M_allocated_capacity + 1);
        }
        return;
      }
      __assert_fail("!in.isComplete()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                    ,0x87,
                    "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                   );
    }
    __assert_fail("in.isComplete()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                  ,0x82,
                  "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
                 );
  }
  __assert_fail("in.isComplete()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testIsComplete.cpp"
                ,0x78,
                "void (anonymous namespace)::checkFiles(const char *, const char *, const char *, const char *)"
               );
}

Assistant:

void
testIsComplete (const std::string &tempDir)
{
    try
    {
	cout << "Testing isComplete() function" << endl;

	std::string csl = tempDir + "imf_test_complete_sl.exr";
	std::string icsl = tempDir + "imf_test_incomplete_sl.exr";
	std::string ct = tempDir + "imf_test_complete_t.exr";
	std::string ict = tempDir + "imf_test_incomplete_t.exr";

	writeFiles (csl.c_str(), icsl.c_str(), ct.c_str(), ict.c_str(), 327, 289, 17, 17);
	checkFiles (csl.c_str(), icsl.c_str(), ct.c_str(), ict.c_str());

	remove (csl.c_str());
	remove (icsl.c_str());
	remove (ct.c_str());
	remove (ict.c_str());

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}